

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O0

Matrix<float,_3,_3> * __thiscall
deqp::gles3::Functional::MatrixCaseUtils::outerProduct<float,3,3>
          (Matrix<float,_3,_3> *__return_storage_ptr__,MatrixCaseUtils *this,Vector<float,_3> *a,
          Vector<float,_3> *b)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  Matrix<float,_3,_3> *extraout_RDX;
  Matrix<float,_3,_3> *mat;
  Matrix<float,_3,_3> *extraout_RDX_00;
  int local_4c;
  int local_48;
  int c;
  int r;
  Matrix<float,_3,_3> retVal;
  Vector<float,_3> *b_local;
  Vector<float,_3> *a_local;
  
  retVal.m_data.m_data[2].m_data._4_8_ = a;
  tcu::Matrix<float,_3,_3>::Matrix((Matrix<float,_3,_3> *)&c);
  mat = extraout_RDX;
  for (local_48 = 0; local_48 < 3; local_48 = local_48 + 1) {
    for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
      pfVar3 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)this,local_4c);
      fVar1 = *pfVar3;
      pfVar3 = tcu::Vector<float,_3>::operator[]
                         ((Vector<float,_3> *)retVal.m_data.m_data[2].m_data._4_8_,local_48);
      fVar2 = *pfVar3;
      pfVar3 = tcu::Matrix<float,_3,_3>::operator()((Matrix<float,_3,_3> *)&c,local_48,local_4c);
      *pfVar3 = fVar1 * fVar2;
      mat = extraout_RDX_00;
    }
  }
  tcu::transpose<float,3,3>(__return_storage_ptr__,(tcu *)&c,mat);
  tcu::Matrix<float,_3,_3>::~Matrix((Matrix<float,_3,_3> *)&c);
  return __return_storage_ptr__;
}

Assistant:

tcu::Matrix<T, Cols, Rows> outerProduct (const tcu::Vector<T, Cols>& a, const tcu::Vector<T, Rows>& b)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = a[c] * b[r];

	return transpose(retVal); // to gl-form (column-major)
}